

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O0

EGLContext
eglu::createGLContext
          (Library *egl,EGLDisplay display,EGLContext eglConfig,ContextType *contextType,
          ResetNotificationStrategy resetNotificationStrategy)

{
  ContextType *pCVar1;
  EGLDisplay pvVar2;
  bool bVar3;
  int iVar4;
  ContextFlags CVar5;
  deUint32 dVar6;
  deBool dVar7;
  NotSupportedError *pNVar8;
  InternalError *pIVar9;
  reference pvVar10;
  EGLContext pvVar11;
  bool local_1b2;
  value_type_conflict1 local_128 [4];
  ApiType local_118;
  value_type_conflict1 local_114;
  ApiType local_110;
  value_type_conflict1 local_10c [2];
  Version local_104;
  Version local_fc;
  allocator<char> local_f1;
  string local_f0;
  ApiType local_d0;
  uint local_cc;
  ApiType local_c8;
  EGLint flags;
  value_type_conflict1 local_c0;
  int local_bc;
  value_type_conflict1 local_b8;
  int local_b4;
  value_type_conflict1 local_b0;
  int local_ac;
  value_type_conflict1 local_a8;
  int local_a4;
  value_type_conflict1 local_a0;
  int local_9c;
  value_type_conflict1 local_98;
  ApiType local_94;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> attribList;
  EGLenum api;
  EGLContext context;
  allocator<char> local_51;
  string local_50;
  byte local_2d;
  ResetNotificationStrategy local_2c;
  bool khrCreateContextSupported;
  ApiType *pAStack_28;
  ResetNotificationStrategy resetNotificationStrategy_local;
  ContextType *contextType_local;
  EGLContext eglConfig_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  local_2c = resetNotificationStrategy;
  pAStack_28 = &contextType->super_ApiType;
  contextType_local = (ContextType *)eglConfig;
  eglConfig_local = display;
  display_local = egl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"EGL_KHR_create_context",&local_51);
  bVar3 = hasExtension(egl,display,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x3038;
  local_2d = bVar3;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
  local_94.m_bits = ((ApiType *)&pAStack_28->m_bits)->m_bits;
  bVar3 = glu::isContextTypeES((ContextType)local_94.m_bits);
  if (bVar3) {
    attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0x30a0;
    iVar4 = glu::ApiType::getMajorVersion(pAStack_28);
    if (iVar4 < 3) {
      local_98 = 0x3098;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_90,&local_98);
      local_9c = glu::ApiType::getMajorVersion(pAStack_28);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_90,&local_9c);
    }
    else {
      if ((local_2d & 1) == 0) {
        pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar8,"EGL_KHR_create_context is required for OpenGL ES 3.0 and newer",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0x66);
        __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      local_a0 = 0x3098;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_90,&local_a0);
      local_a4 = glu::ApiType::getMajorVersion(pAStack_28);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_90,&local_a4);
      local_a8 = 0x30fb;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_90,&local_a8);
      local_ac = glu::ApiType::getMinorVersion(pAStack_28);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_90,&local_ac);
    }
  }
  else {
    if ((local_2d & 1) == 0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar8,"EGL_KHR_create_context is required for OpenGL context creation",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0x73);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0x30a2;
    local_b0 = 0x3098;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&local_b0);
    local_b4 = glu::ApiType::getMajorVersion(pAStack_28);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&local_b4);
    local_b8 = 0x30fb;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&local_b8);
    local_bc = glu::ApiType::getMinorVersion(pAStack_28);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&local_bc);
    local_c0 = 0x30fd;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&local_c0);
    local_c8.m_bits = pAStack_28->m_bits;
    bVar3 = glu::isContextTypeGLCore((ContextType)local_c8.m_bits);
    flags = 2 - (uint)bVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&flags);
  }
  CVar5 = glu::ContextType::getFlags((ContextType *)pAStack_28);
  if (CVar5 != 0) {
    local_cc = 0;
    if ((local_2d & 1) == 0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar8,
                 "EGL_KHR_create_context is required for creating robust/debug/forward-compatible contexts"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0x85);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    CVar5 = glu::ContextType::getFlags((ContextType *)pAStack_28);
    CVar5 = glu::operator&(CVar5,CONTEXT_DEBUG);
    if (CVar5 != 0) {
      local_cc = local_cc | 1;
    }
    CVar5 = glu::ContextType::getFlags((ContextType *)pAStack_28);
    CVar5 = glu::operator&(CVar5,CONTEXT_ROBUST);
    if (CVar5 != 0) {
      local_d0.m_bits = pAStack_28->m_bits;
      bVar3 = glu::isContextTypeES((ContextType)local_d0.m_bits);
      pvVar2 = display_local;
      pvVar11 = eglConfig_local;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"EGL_EXT_create_context_robustness",&local_f1);
        bVar3 = hasExtension((Library *)pvVar2,pvVar11,&local_f0);
        local_1b2 = false;
        if (!bVar3) {
          local_fc = getVersion((Library *)display_local,eglConfig_local);
          Version::Version(&local_104,1,5);
          local_1b2 = Version::operator<(&local_fc,&local_104);
        }
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
        if (local_1b2 != false) {
          pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar8,
                     "EGL_EXT_create_context_robustness is required for creating robust context",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                     ,0x8f);
          __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        local_10c[1] = 0x30bf;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_90,local_10c + 1);
        local_10c[0] = 1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_90,local_10c);
      }
      else {
        local_cc = local_cc | 4;
      }
    }
    CVar5 = glu::ContextType::getFlags((ContextType *)pAStack_28);
    CVar5 = glu::operator&(CVar5,CONTEXT_FORWARD_COMPATIBLE);
    if (CVar5 != 0) {
      local_110.m_bits = pAStack_28->m_bits;
      bVar3 = glu::isContextTypeGLCore((ContextType)local_110.m_bits);
      if (!bVar3) {
        pIVar9 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar9,"Only OpenGL core contexts can be forward-compatible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0x9b);
        __cxa_throw(pIVar9,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      local_cc = local_cc | 2;
    }
    local_114 = 0x30fc;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&local_114);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,(value_type_conflict1 *)&local_cc);
    if (local_2c != RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED) {
      local_118.m_bits = pAStack_28->m_bits;
      bVar3 = glu::isContextTypeES((ContextType)local_118.m_bits);
      if (bVar3) {
        pIVar9 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar9,
                   "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0xa6);
        __cxa_throw(pIVar9,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      local_128[3] = 0x31bd;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_90,local_128 + 3);
      if (local_2c == RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION) {
        local_128[2] = 0x31be;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_90,local_128 + 2);
      }
      else {
        if (local_2c != RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET) {
          pIVar9 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (pIVar9,"Unknown reset notification strategy",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                     ,0xaf);
          __cxa_throw(pIVar9,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
        }
        local_128[1] = 0x31bf;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_90,local_128 + 1);
      }
    }
  }
  local_128[0] = 0x3038;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_90,local_128);
  do {
    (*(code *)**display_local)
              (display_local,
               attribList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar6 = (**(code **)(*display_local + 0xf8))();
    checkError(dVar6,"bindAPI(api)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0xb5);
    dVar7 = ::deGetFalse();
    pvVar2 = display_local;
    pvVar11 = eglConfig_local;
    pCVar1 = contextType_local;
  } while (dVar7 != 0);
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_90,0);
  pvVar11 = (EGLContext)(**(code **)(*pvVar2 + 0x30))(pvVar2,pvVar11,pCVar1,0,pvVar10);
  dVar6 = (**(code **)(*display_local + 0xf8))();
  checkError(dVar6,"eglCreateContext()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
             ,0xb7);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  return pvVar11;
}

Assistant:

EGLContext createGLContext (const Library&					egl,
							EGLDisplay						display,
							EGLContext						eglConfig,
							const glu::ContextType&			contextType,
							glu::ResetNotificationStrategy	resetNotificationStrategy)
{
	const bool			khrCreateContextSupported	= hasExtension(egl, display, "EGL_KHR_create_context");
	EGLContext			context						= EGL_NO_CONTEXT;
	EGLenum				api							= EGL_NONE;
	vector<EGLint>		attribList;

	if (glu::isContextTypeES(contextType))
	{
		api = EGL_OPENGL_ES_API;

		if (contextType.getMajorVersion() <= 2)
		{
			attribList.push_back(EGL_CONTEXT_CLIENT_VERSION);
			attribList.push_back(contextType.getMajorVersion());
		}
		else
		{
			if (!khrCreateContextSupported)
				TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for OpenGL ES 3.0 and newer");

			attribList.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
			attribList.push_back(contextType.getMajorVersion());
			attribList.push_back(EGL_CONTEXT_MINOR_VERSION_KHR);
			attribList.push_back(contextType.getMinorVersion());
		}
	}
	else
	{
		DE_ASSERT(glu::isContextTypeGLCore(contextType) || glu::isContextTypeGLCompatibility(contextType));

		if (!khrCreateContextSupported)
			TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for OpenGL context creation");

		api = EGL_OPENGL_API;

		attribList.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
		attribList.push_back(contextType.getMajorVersion());
		attribList.push_back(EGL_CONTEXT_MINOR_VERSION_KHR);
		attribList.push_back(contextType.getMinorVersion());
		attribList.push_back(EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR);
		attribList.push_back(glu::isContextTypeGLCore(contextType) ? EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR
																   : EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR);
	}

	if (contextType.getFlags() != glu::ContextFlags(0))
	{
		EGLint flags = 0;

		if (!khrCreateContextSupported)
			TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for creating robust/debug/forward-compatible contexts");

		if ((contextType.getFlags() & glu::CONTEXT_DEBUG) != 0)
			flags |= EGL_CONTEXT_OPENGL_DEBUG_BIT_KHR;

		if ((contextType.getFlags() & glu::CONTEXT_ROBUST) != 0)
		{
			if (glu::isContextTypeES(contextType))
			{
				if (!hasExtension(egl, display, "EGL_EXT_create_context_robustness") && (getVersion(egl, display) < Version(1, 5)))
					TCU_THROW(NotSupportedError, "EGL_EXT_create_context_robustness is required for creating robust context");

				attribList.push_back(EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT);
				attribList.push_back(EGL_TRUE);
			}
			else
				flags |= EGL_CONTEXT_OPENGL_ROBUST_ACCESS_BIT_KHR;
		}

		if ((contextType.getFlags() & glu::CONTEXT_FORWARD_COMPATIBLE) != 0)
		{
			if (!glu::isContextTypeGLCore(contextType))
				TCU_THROW(InternalError, "Only OpenGL core contexts can be forward-compatible");

			flags |= EGL_CONTEXT_OPENGL_FORWARD_COMPATIBLE_BIT_KHR;
		}

		attribList.push_back(EGL_CONTEXT_FLAGS_KHR);
		attribList.push_back(flags);

		if (resetNotificationStrategy != glu::RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED)
		{
			if (glu::isContextTypeES(contextType))
				TCU_THROW(InternalError, "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts");

			attribList.push_back(EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_KHR);

			if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION)
				attribList.push_back(EGL_NO_RESET_NOTIFICATION_KHR);
			else if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET)
				attribList.push_back(EGL_LOSE_CONTEXT_ON_RESET_KHR);
			else
				TCU_THROW(InternalError, "Unknown reset notification strategy");
		}
	}

	attribList.push_back(EGL_NONE);

	EGLU_CHECK_CALL(egl, bindAPI(api));
	context = egl.createContext(display, eglConfig, EGL_NO_CONTEXT, &(attribList[0]));
	EGLU_CHECK_MSG(egl, "eglCreateContext()");

	return context;
}